

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O0

int av1_compute_q_from_energy_level_deltaq_mode(AV1_COMP *cpi,int block_var_level)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  AV1_COMP *unaff_retaddr;
  int qindex_delta;
  int base_qindex;
  AV1_COMMON *cm;
  int rate_level;
  int local_20;
  
  iVar1 = *(int *)(in_RDI + 0x3c1e8);
  local_20 = av1_compute_qdelta_by_rate
                       (unaff_retaddr,(FRAME_TYPE)((ulong)in_RDI >> 0x38),(int)in_RDI,
                        (double)CONCAT44(in_ESI,segment_id[in_ESI + 4]));
  if ((iVar1 != 0) && (iVar1 + local_20 == 0)) {
    local_20 = 1 - iVar1;
  }
  return iVar1 + local_20;
}

Assistant:

int av1_compute_q_from_energy_level_deltaq_mode(const AV1_COMP *const cpi,
                                                int block_var_level) {
  int rate_level;
  const AV1_COMMON *const cm = &cpi->common;

  if (DELTA_Q_PERCEPTUAL_MODULATION == 1) {
    ENERGY_IN_BOUNDS(block_var_level);
    rate_level = SEGMENT_ID(block_var_level);
  } else {
    rate_level = block_var_level;
  }
  const int base_qindex = cm->quant_params.base_qindex;
  int qindex_delta =
      av1_compute_qdelta_by_rate(cpi, cm->current_frame.frame_type, base_qindex,
                                 deltaq_rate_ratio[rate_level]);

  if ((base_qindex != 0) && ((base_qindex + qindex_delta) == 0)) {
    qindex_delta = -base_qindex + 1;
  }
  return base_qindex + qindex_delta;
}